

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSSpStructMatrix.cpp
# Opt level: O0

TPZStructMatrix * __thiscall
TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::Clone
          (TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  TPZStructMatrix *pTVar1;
  TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_> *in_RDI;
  TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  *unaff_retaddr;
  
  pTVar1 = (TPZStructMatrix *)operator_new(0xc0);
  TPZSSpStructMatrix(unaff_retaddr,in_RDI);
  return pTVar1;
}

Assistant:

TPZStructMatrix * TPZSSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZSSpStructMatrix(*this);
}